

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFont::FFont(FFont *this,int lump)

{
  int lump_local;
  FFont *this_local;
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_009fd290;
  TArray<FRemapTable,_FRemapTable>::TArray(&this->Ranges);
  this->Lump = lump;
  this->Chars = (CharData *)0x0;
  this->PatchRemap = (BYTE *)0x0;
  this->Name = (char *)0x0;
  this->Cursor = '_';
  return;
}

Assistant:

FFont::FFont (int lump)
{
	Lump = lump;
	Chars = NULL;
	PatchRemap = NULL;
	Name = NULL;
	Cursor = '_';
}